

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chardev.c
# Opt level: O1

LispPTR CHAR_bin(int fd,LispPTR errn)

{
  int iVar1;
  undefined8 in_RAX;
  int *piVar2;
  ssize_t sVar3;
  uint __fd;
  uchar ch [4];
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if ((errn & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)errn);
  }
  Lisp_errno = (int *)(Lisp_world + errn);
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    if ((fd & 0xfff0000U) == 0xf0000) {
      __fd = fd | 0xffff0000;
    }
    else if ((fd & 0xfff0000U) == 0xe0000) {
      __fd = fd & 0xffff;
    }
    else {
      if ((fd & 1U) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)(uint)fd);
      }
      __fd = *(uint *)(Lisp_world + (uint)fd);
    }
    alarm(TIMEOUT_TIME);
    piVar2 = __errno_location();
    do {
      *piVar2 = 0;
      sVar3 = read(__fd,(void *)((long)&uStack_38 + 4),1);
      if (sVar3 != -1) break;
    } while (*piVar2 == 4);
    alarm(0);
    if (sVar3 == 0) {
      *Lisp_errno = 0xb;
      return 0;
    }
    if (sVar3 != -1) {
      return uStack_38._4_1_ | 0xe0000;
    }
    *Lisp_errno = *piVar2;
  }
  else {
    *Lisp_errno = 100;
  }
  return 0;
}

Assistant:

LispPTR CHAR_bin(int fd, LispPTR errn)
{
#ifndef DOS
  ssize_t rval;
  unsigned char ch[4];
  Lisp_errno = (int *)NativeAligned4FromLAddr(errn);
  ERRSETJMP(NIL);
  fd = LispNumToCInt(fd);

  TIMEOUT(rval = read(fd, ch, 1));
  if (rval == 0) {
    *Lisp_errno = EWOULDBLOCK;
    return (NIL);
  }
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }
  return (GetPosSmallp(ch[0]));
#endif /* DOS */
}